

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseBandwidth.cpp
# Opt level: O0

void __thiscall
tonk::ReceiverBandwidthControl::Initialize(ReceiverBandwidthControl *this,Dependencies *deps)

{
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  Sample sample;
  Sample *in_stack_ffffffffffffff88;
  WindowedMinMax<Counter<unsigned_int,_32U>,_siamese::WindowedMinCompare<Counter<unsigned_int,_32U>_>_>
  *this_00;
  Counter<unsigned_int,_32U> *in_stack_ffffffffffffff98;
  Counter<unsigned_int,_32U> *value;
  Sample *in_stack_ffffffffffffffa0;
  WindowedMinMax<unsigned_int,_siamese::WindowedMaxCompare<unsigned_int>_> *this_01;
  Sample local_50;
  Counter<unsigned_int,_32U> local_3c [6];
  Counter<unsigned_int,_32U> local_24 [9];
  
  *in_RDI = *in_RSI;
  in_RDI[1] = in_RSI[1];
  *(undefined4 *)(in_RDI + 0x14) = 13000;
  *(undefined4 *)((long)in_RDI + 0xa4) = 0x3c23d70a;
  *(undefined1 *)(in_RDI + 0x15) = 0;
  this_00 = (WindowedMinMax<Counter<unsigned_int,_32U>,_siamese::WindowedMinCompare<Counter<unsigned_int,_32U>_>_>
             *)(in_RDI + 0x16);
  Counter<unsigned_int,_32U>::Counter(local_24,0);
  siamese::
  WindowedMinMax<Counter<unsigned_int,_32U>,_siamese::WindowedMinCompare<Counter<unsigned_int,_32U>_>_>
  ::Sample::Sample(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,(TimeT)this_00);
  siamese::
  WindowedMinMax<Counter<unsigned_int,_32U>,_siamese::WindowedMinCompare<Counter<unsigned_int,_32U>_>_>
  ::Reset(this_00,in_stack_ffffffffffffff88);
  *(undefined4 *)(in_RDI + 0x1d) = 100000;
  value = (Counter<unsigned_int,_32U> *)(in_RDI + 0x1e);
  Counter<unsigned_int,_32U>::Counter(local_3c,0);
  siamese::
  WindowedMinMax<Counter<unsigned_int,_32U>,_siamese::WindowedMinCompare<Counter<unsigned_int,_32U>_>_>
  ::Sample::Sample(in_stack_ffffffffffffffa0,value,(TimeT)this_00);
  siamese::
  WindowedMinMax<Counter<unsigned_int,_32U>,_siamese::WindowedMinCompare<Counter<unsigned_int,_32U>_>_>
  ::Reset(this_00,in_stack_ffffffffffffff88);
  *(undefined4 *)(in_RDI + 0x25) = 1000000;
  this_01 = (WindowedMinMax<unsigned_int,_siamese::WindowedMaxCompare<unsigned_int>_> *)
            (in_RDI + 0x26);
  siamese::WindowedMinMax<unsigned_int,_siamese::WindowedMaxCompare<unsigned_int>_>::Sample::Sample
            (&local_50,0,0);
  sample._4_4_ = 0;
  sample.Value = local_50.Value;
  sample.Timestamp = local_50.Timestamp;
  siamese::WindowedMinMax<unsigned_int,_siamese::WindowedMaxCompare<unsigned_int>_>::Reset
            (this_01,sample);
  *(undefined1 *)(in_RDI + 0x2d) = 1;
  *(undefined4 *)((long)in_RDI + 0x16c) = 1;
  return;
}

Assistant:

void ReceiverBandwidthControl::Initialize(const Dependencies& deps)
{
    Deps = deps;

    NextShape.AppBPS = protocol::kBandwidthBurstTokenLimit;
    NextShape.FECRate = TONK_MIN_FEC_RATE;

    ShouldAckFast = false;

    RecentOWD.Reset();
    RecentOWD_WindowUsec = 100 * 1000;

    MinOWD.Reset();
    MinOWD_WindowUsec = 1000 * 1000;

    RecentMaxBW.Reset();

    InSlowStart = true;
    Momentum = 1;
}